

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBoxPrivate::updateViewContainerPaletteAndOpacity(QComboBoxPrivate *this)

{
  QPointer<QComboBoxPrivateContainer> *this_00;
  long lVar1;
  QWidget *this_01;
  Data *pDVar2;
  qreal opacity;
  bool bVar3;
  int iVar4;
  QStyle *pQVar5;
  QPalette *pQVar6;
  QWidget *pQVar7;
  long in_FS_OFFSET;
  QMenu menu;
  QStyleOptionComboBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->container;
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar3) {
    this_01 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    memset(&opt,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox(&opt);
    (**(code **)(*(long *)this_01 + 0x1b8))(this_01,&opt);
    pQVar5 = QWidget::style(this_01);
    iVar4 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x19,&opt,this_01,0);
    if (iVar4 == 0) {
      pDVar2 = (this_00->wp).d;
      if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
        pQVar7 = (QWidget *)0x0;
      }
      else {
        pQVar7 = (QWidget *)(this->container).wp.value;
      }
      pQVar6 = QWidget::palette(this_01);
      QWidget::setPalette(pQVar7,pQVar6);
      QWidget::setWindowOpacity((QWidget *)(this->container).wp.value,1.0);
    }
    else {
      menu.super_QWidget.data = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
      menu.super_QWidget._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      menu.super_QWidget._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      menu.super_QWidget._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      menu.super_QWidget._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar7 = (QWidget *)0x0;
      QMenu::QMenu(&menu,(QWidget *)0x0);
      QWidget::ensurePolished(&menu.super_QWidget);
      pDVar2 = (this_00->wp).d;
      if (pDVar2 != (Data *)0x0) {
        if (*(int *)(pDVar2 + 4) == 0) {
          pQVar7 = (QWidget *)0x0;
        }
        else {
          pQVar7 = (QWidget *)(this->container).wp.value;
        }
      }
      pQVar6 = QWidget::palette(&menu.super_QWidget);
      QWidget::setPalette(pQVar7,pQVar6);
      pDVar2 = (this_00->wp).d;
      if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
        pQVar7 = (QWidget *)0x0;
      }
      else {
        pQVar7 = (QWidget *)(this->container).wp.value;
      }
      opacity = QWidget::windowOpacity(&menu.super_QWidget);
      QWidget::setWindowOpacity(pQVar7,opacity);
      QMenu::~QMenu(&menu);
    }
    pQVar7 = &this->lineEdit->super_QWidget;
    if (pQVar7 != (QWidget *)0x0) {
      pQVar6 = QWidget::palette(this_01);
      QWidget::setPalette(pQVar7,pQVar6);
    }
    QStyleOptionComboBox::~QStyleOptionComboBox(&opt);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::updateViewContainerPaletteAndOpacity()
{
    if (!container)
        return;
    Q_Q(QComboBox);
    QStyleOptionComboBox opt;
    q->initStyleOption(&opt);
#if QT_CONFIG(menu)
    if (q->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, q)) {
        QMenu menu;
        menu.ensurePolished();
        container->setPalette(menu.palette());
        container->setWindowOpacity(menu.windowOpacity());
    } else
#endif
    {
        container->setPalette(q->palette());
        container->setWindowOpacity(1.0);
    }
    if (lineEdit)
        lineEdit->setPalette(q->palette());
}